

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,char *significand,
          int significand_size,int integral_size,wchar_t decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_48;
  buffer<wchar_t> *local_40;
  buffer<wchar_t> *local_38;
  wchar_t local_2c;
  int local_28;
  wchar_t decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  local_40 = out.container;
  local_2c = decimal_point;
  local_28 = integral_size;
  decimal_point_local = significand_size;
  _integral_size_local = significand;
  significand_local = (char *)out.container;
  local_38 = (buffer<wchar_t> *)
             copy_str_noinline<wchar_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                       (significand,significand + integral_size,out);
  out_local = (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_38;
  if (local_2c != L'\0') {
    significand_local = (char *)local_38;
    local_48 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator++
                         ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *)
                          &significand_local,0);
    this = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator*(&local_48);
    std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator=(this,&local_2c);
    out_local = copy_str_noinline<wchar_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                          (_integral_size_local + local_28,
                           _integral_size_local + decimal_point_local,
                           (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)
                           significand_local);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}